

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

void __thiscall google::protobuf::MapValueRef::DeleteData(MapValueRef *this)

{
  string *this_00;
  void *pvVar1;
  ulong uVar2;
  
  switch(this->type_) {
  case 1:
  case 3:
  case 6:
  case 8:
    pvVar1 = this->data_;
    uVar2 = 4;
    break;
  case 2:
  case 4:
  case 5:
    pvVar1 = this->data_;
    uVar2 = 8;
    break;
  case 7:
    pvVar1 = this->data_;
    uVar2 = 1;
    break;
  case 9:
    this_00 = (string *)this->data_;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string(this_00);
    }
    operator_delete(this_00,0x20);
    return;
  case 10:
    if ((long *)this->data_ != (long *)0x0) {
      (**(code **)(*this->data_ + 8))();
      return;
    }
  default:
    return;
  }
  operator_delete(pvVar1,uVar2);
  return;
}

Assistant:

void DeleteData() {
    switch (type_) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                              \
      case google::protobuf::FieldDescriptor::CPPTYPE_##CPPTYPE: {        \
        delete reinterpret_cast<TYPE*>(data_);                  \
        break;                                                  \
      }
      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(ENUM, int32);
      HANDLE_TYPE(MESSAGE, Message);
#undef HANDLE_TYPE
    }
  }